

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<get_proj_subspace_test_lowbd::GetProjSubspaceTest_DISABLED_Speed_Test>::
CreateTest(ParameterizedTestFactory<get_proj_subspace_test_lowbd::GetProjSubspaceTest_DISABLED_Speed_Test>
           *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<std::tuple<void_(*const)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_int_*,_int,_int_*,_int,_long_(*)[2],_long_*,_const_sgr_params_type_*)>_>
  ::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x48);
  get_proj_subspace_test_lowbd::GetProjSubspaceTest_DISABLED_Speed_Test::
  GetProjSubspaceTest_DISABLED_Speed_Test((GetProjSubspaceTest_DISABLED_Speed_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }